

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O1

bool __thiscall
tf::Executor::_invoke_runtime_task_impl
          (Executor *this,Worker *worker,Node *node,function<void_(tf::Runtime_&)> *work)

{
  undefined8 uVar1;
  _Hash_node_base *p_Var2;
  Runtime rt;
  Runtime local_48;
  
  if (((uint)node->_nstate >> 0x1d & 1) == 0) {
    local_48._preempted = false;
    local_48._executor = this;
    local_48._worker = worker;
    local_48._parent = node;
    for (p_Var2 = (this->_observers)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
        p_Var2 = p_Var2->_M_nxt) {
      (*(code *)(p_Var2[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var2[1]._M_nxt,worker,node);
    }
    if ((work->super__Function_base)._M_manager == (_Manager_type)0x0) {
      uVar1 = std::__throw_bad_function_call();
      __cxa_begin_catch(uVar1);
      _process_exception(this,worker,node);
      __cxa_end_catch();
    }
    else {
      (*work->_M_invoker)((_Any_data *)work,&local_48);
    }
    for (p_Var2 = (this->_observers)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
        p_Var2 = p_Var2->_M_nxt) {
      (*(code *)(p_Var2[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var2[1]._M_nxt,worker,node);
    }
    if (local_48._preempted != false) {
      return true;
    }
  }
  else {
    node->_nstate = node->_nstate & 0xdfffffff;
  }
  return false;
}

Assistant:

inline bool Executor::_invoke_runtime_task_impl(
  Worker& worker, Node* node, std::function<void(Runtime&)>& work
) {
  // first time
  if((node->_nstate & NSTATE::PREEMPTED) == 0) {

    Runtime rt(*this, worker, node);

    _observer_prologue(worker, node);
    TF_EXECUTOR_EXCEPTION_HANDLER(worker, node, {
      work(rt);
    });
    _observer_epilogue(worker, node);
    
    // here, we cannot check the state from node->_nstate due to data race
    if(rt._preempted) {
      return true;
    }
  }
  // second time - previously preempted
  else {
    node->_nstate &= ~NSTATE::PREEMPTED;
  }
  return false;
}